

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkPermutePiUsingFanout(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  
  qsort(pNtk->vPis->pArray,(long)pNtk->vPis->nSize,8,Abc_NodeCompareByFanoutCount);
  pNtk->vCis->nSize = 0;
  pVVar4 = pNtk->vPis;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar4->pArray[lVar6];
      pVVar4 = pNtk->vCis;
      uVar1 = pVVar4->nSize;
      if (uVar1 == pVVar4->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      iVar2 = pVVar4->nSize;
      pVVar4->nSize = iVar2 + 1;
      ppvVar5[iVar2] = pvVar3;
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vPis;
    } while (lVar6 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode; int i;
    qsort( (void *)Vec_PtrArray(pNtk->vPis), Vec_PtrSize(pNtk->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareByFanoutCount );
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vPis, pNode, i )
        Vec_PtrPush( pNtk->vCis, pNode );
}